

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer ppcVar1;
  cmake *pcVar2;
  bool bVar3;
  cmMakefile *this_00;
  cmState *this_01;
  char *pcVar4;
  cmOutputConverter conv;
  cmStateSnapshot snapshot;
  allocator local_c1;
  cmStateDirectory local_c0;
  string local_98;
  string local_78;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&local_78);
  cmGlobalGenerator::SelectMakeProgram
            ((string *)&local_c0,(cmGlobalGenerator *)this,makeProgram,&local_98);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
            (&local_c0,this);
  bVar3 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     (char (*) [16])"NMake Makefiles");
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_c0,"/NOLOGO",(allocator *)&local_98);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (targetName->_M_string_length != 0) {
    ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar1 ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      local_78.field_2._M_allocated_capacity = (pcVar2->CurrentSnapshot).Position.Position;
      local_78._M_dataplus._M_p = (pointer)(pcVar2->CurrentSnapshot).State;
      local_78._M_string_length = (size_type)(pcVar2->CurrentSnapshot).Position.Tree;
      cmStateSnapshot::GetDirectory(&local_c0,(cmStateSnapshot *)&local_78);
      pcVar4 = cmake::GetHomeDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_98,pcVar4,(allocator *)&local_50);
      cmStateDirectory::SetCurrentSource(&local_c0,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      cmStateSnapshot::GetDirectory(&local_c0,(cmStateSnapshot *)&local_78);
      pcVar4 = cmake::GetHomeOutputDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_98,pcVar4,(allocator *)&local_50);
      cmStateDirectory::SetCurrentBinary(&local_c0,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&local_78);
      this_00 = (cmMakefile *)operator_new(0x760);
      cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)&local_78);
    }
    else {
      this_00 = *ppcVar1;
    }
    std::__cxx11::string::string((string *)&local_c0,(string *)targetName);
    if (fast) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    cmMakefile::GetStateSnapshot(this_00);
    cmOutputConverter::cmOutputConverter
              ((cmOutputConverter *)&local_98,(cmStateSnapshot *)&local_78);
    this_01 = cmMakefile::GetState(this_00);
    pcVar4 = cmState::GetBinaryDirectory(this_01);
    std::__cxx11::string::string((string *)&local_50,pcVar4,&local_c1);
    cmOutputConverter::ConvertToRelativePath
              (&local_78,(cmOutputConverter *)&local_98,&local_50,(string *)&local_c0);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    cmSystemTools::ConvertToOutputSlashes((string *)&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,(value_type *)&local_c0);
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmMakefile::~cmMakefile(this_00);
      operator_delete(this_00,0x760);
    }
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  std::vector<std::string>& makeCommand, const std::string& makeProgram,
  const std::string& /*projectName*/, const std::string& /*projectDir*/,
  const std::string& targetName, const std::string& /*config*/, bool fast,
  bool /*verbose*/, std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(this->SelectMakeProgram(makeProgram));

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles")) {
    makeCommand.push_back("/NOLOGO");
  }
  makeCommand.insert(makeCommand.end(), makeOptions.begin(),
                     makeOptions.end());
  if (!targetName.empty()) {
    cmMakefile* mf;
    if (!this->Makefiles.empty()) {
      mf = this->Makefiles[0];
    } else {
      cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
      snapshot.GetDirectory().SetCurrentSource(
        this->CMakeInstance->GetHomeDirectory());
      snapshot.GetDirectory().SetCurrentBinary(
        this->CMakeInstance->GetHomeOutputDirectory());
      snapshot.SetDefaultDefinitions();
      mf = new cmMakefile(this, snapshot);
    }

    std::string tname = targetName;
    if (fast) {
      tname += "/fast";
    }
    cmOutputConverter conv(mf->GetStateSnapshot());
    tname =
      conv.ConvertToRelativePath(mf->GetState()->GetBinaryDirectory(), tname);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->Makefiles.empty()) {
      delete mf;
    }
  }
}